

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O0

void deqp::egl::initSurface(Functions *gl,IVec2 *oldSize)

{
  int *piVar1;
  Vector<float,_3> local_f4;
  Vector<int,_2> local_e8;
  Vector<int,_2> local_e0;
  Vector<float,_3> local_d8;
  Vector<int,_2> local_cc;
  Vector<int,_2> local_c4;
  Vector<float,_3> local_bc;
  Vector<int,_2> local_b0;
  Vector<int,_2> local_a8;
  IVec2 local_a0;
  Vector<float,_3> local_98;
  Vector<int,_2> local_8c;
  Vector<int,_2> local_84;
  Vector<float,_3> local_7c;
  Vector<int,_2> local_70;
  IVec2 local_68;
  Vector<int,_2> local_60;
  Vector<float,_3> local_58;
  Vector<int,_2> local_4c;
  Vector<int,_2> local_44;
  undefined1 local_3c [8];
  Vec3 markColor;
  Vec3 fillColor;
  Vec3 frameColor;
  IVec2 *oldSize_local;
  Functions *gl_local;
  
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(fillColor.m_data + 1),0.0,0.0,1.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(markColor.m_data + 1),1.0,0.0,0.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_3c,0.0,1.0,0.0);
  tcu::Vector<int,_2>::Vector(&local_44,0,0);
  tcu::Vector<int,_2>::Vector(&local_4c,oldSize);
  tcu::Vector<float,_3>::Vector(&local_58,(Vector<float,_3> *)(fillColor.m_data + 1));
  drawRectangle(gl,&local_44,&local_4c,&local_58);
  tcu::Vector<int,_2>::Vector(&local_60,2,2);
  tcu::Vector<int,_2>::Vector(&local_70,4,4);
  tcu::operator-((tcu *)&local_68,oldSize,&local_70);
  tcu::Vector<float,_3>::Vector(&local_7c,(Vector<float,_3> *)(markColor.m_data + 1));
  drawRectangle(gl,&local_60,&local_68,&local_7c);
  tcu::Vector<int,_2>::Vector(&local_84,0,0);
  tcu::Vector<int,_2>::Vector(&local_8c,8,4);
  tcu::Vector<float,_3>::Vector(&local_98,(Vector<float,_3> *)local_3c);
  drawRectangle(gl,&local_84,&local_8c,&local_98);
  tcu::Vector<int,_2>::Vector(&local_a8,0x10,0x10);
  tcu::operator-((tcu *)&local_a0,oldSize,&local_a8);
  tcu::Vector<int,_2>::Vector(&local_b0,8,4);
  tcu::Vector<float,_3>::Vector(&local_bc,(Vector<float,_3> *)local_3c);
  drawRectangle(gl,&local_a0,&local_b0,&local_bc);
  piVar1 = tcu::Vector<int,_2>::y(oldSize);
  tcu::Vector<int,_2>::Vector(&local_c4,0,*piVar1 + -0x10);
  tcu::Vector<int,_2>::Vector(&local_cc,8,4);
  tcu::Vector<float,_3>::Vector(&local_d8,(Vector<float,_3> *)local_3c);
  drawRectangle(gl,&local_c4,&local_cc,&local_d8);
  piVar1 = tcu::Vector<int,_2>::x(oldSize);
  tcu::Vector<int,_2>::Vector(&local_e0,*piVar1 + -0x10,0);
  tcu::Vector<int,_2>::Vector(&local_e8,8,4);
  tcu::Vector<float,_3>::Vector(&local_f4,(Vector<float,_3> *)local_3c);
  drawRectangle(gl,&local_e0,&local_e8,&local_f4);
  return;
}

Assistant:

void initSurface (const glw::Functions& gl, IVec2 oldSize)
{
	const Vec3	frameColor	(0.0f, 0.0f, 1.0f);
	const Vec3	fillColor	(1.0f, 0.0f, 0.0f);
	const Vec3	markColor	(0.0f, 1.0f, 0.0f);

	drawRectangle(gl, IVec2(0, 0), oldSize, frameColor);
	drawRectangle(gl, IVec2(2, 2), oldSize - IVec2(4, 4), fillColor);

	drawRectangle(gl, IVec2(0, 0), IVec2(8, 4), markColor);
	drawRectangle(gl, oldSize - IVec2(16, 16), IVec2(8, 4), markColor);
	drawRectangle(gl, IVec2(0, oldSize.y() - 16), IVec2(8, 4), markColor);
	drawRectangle(gl, IVec2(oldSize.x() - 16, 0), IVec2(8, 4), markColor);
}